

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxLocalVariable::Emit(FxLocalVariable *this,VMFunctionBuilder *build)

{
  ExpEmit EVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int type;
  uint uVar5;
  VMFunctionBuilder *build_local;
  FxLocalVariable *this_local;
  ExpEmit reg;
  
  if ((this->Variable->VarFlags & 0x800U) == 0) {
    iVar2 = this->Variable->RegNum;
    iVar3 = this->RegOffset;
    type = PType::GetRegType((this->Variable->super_FxExpression).ValueType);
    ExpEmit::ExpEmit((ExpEmit *)&this_local,iVar2 + iVar3,type,false,true);
    iVar2 = PType::GetRegCount((this->super_FxExpression).ValueType);
    this_local._3_4_ = CONCAT31(this_local._4_3_,(char)iVar2);
    if ((this->AddressRequested & 1U) != 0) {
      this_local._7_1_ = true;
    }
  }
  else if ((this->AddressRequested & 1U) == 0) {
    iVar2 = PType::GetRegType((this->super_FxExpression).ValueType);
    iVar3 = PType::GetRegCount((this->super_FxExpression).ValueType);
    ExpEmit::ExpEmit((ExpEmit *)&this_local,build,iVar2,iVar3);
    iVar3 = PType::GetLoadOp((this->super_FxExpression).ValueType);
    uVar5 = (uint)(ushort)this_local;
    iVar2 = this->Variable->RegNum;
    uVar4 = VMFunctionBuilder::GetConstantInt(build,this->RegOffset);
    VMFunctionBuilder::Emit(build,iVar3,uVar5,iVar2,uVar4);
  }
  else if (this->RegOffset == 0) {
    ExpEmit::ExpEmit((ExpEmit *)&this_local,this->Variable->RegNum,3,false,true);
  }
  else {
    ExpEmit::ExpEmit((ExpEmit *)&this_local,build,3,1);
    uVar5 = (uint)(ushort)this_local;
    iVar2 = this->Variable->RegNum;
    uVar4 = VMFunctionBuilder::GetConstantInt(build,this->RegOffset);
    VMFunctionBuilder::Emit(build,0xcd,uVar5,iVar2,uVar4);
  }
  EVar1.RegType = this_local._2_1_;
  EVar1.RegNum = (ushort)this_local;
  EVar1.RegCount = this_local._3_1_;
  EVar1.Konst = (bool)this_local._4_1_;
  EVar1.Fixed = (bool)this_local._5_1_;
  EVar1.Final = (bool)this_local._6_1_;
  EVar1.Target = (bool)this_local._7_1_;
  return EVar1;
}

Assistant:

ExpEmit FxLocalVariable::Emit(VMFunctionBuilder *build)
{
	// 'Out' variables are actually pointers but this fact must be hidden to the script.
	if (Variable->VarFlags & VARF_Out)
	{
		if (!AddressRequested)
		{
			ExpEmit reg(build, ValueType->GetRegType(), ValueType->GetRegCount());
			build->Emit(ValueType->GetLoadOp(), reg.RegNum, Variable->RegNum, build->GetConstantInt(RegOffset));
			return reg;
		}
		else
		{
			if (RegOffset == 0) return ExpEmit(Variable->RegNum, REGT_POINTER, false, true);
			ExpEmit reg(build, REGT_POINTER);
			build->Emit(OP_ADDA_RK, reg.RegNum, Variable->RegNum, build->GetConstantInt(RegOffset));
			return reg;
		}
	}
	else
	{
		ExpEmit ret(Variable->RegNum + RegOffset, Variable->ValueType->GetRegType(), false, true);
		ret.RegCount = ValueType->GetRegCount();
		if (AddressRequested) ret.Target = true;
		return ret;
	}
}